

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Generators::GeneratorTracker::~GeneratorTracker(GeneratorTracker *this)

{
  ~GeneratorTracker(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

GeneratorTracker::~GeneratorTracker() {}